

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O2

RPCHelpMan * getrawmempool(void)

{
  string name;
  string name_00;
  string m_key_name;
  string cond;
  string m_key_name_00;
  string cond_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string cond_01;
  string description;
  string m_key_name_04;
  string description_00;
  string m_key_name_05;
  string description_01;
  string description_02;
  string description_03;
  string m_key_name_06;
  string description_04;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  string description_05;
  string description_06;
  string description_07;
  RPCResults results;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  RPCExamples examples;
  string description_08;
  string description_09;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> results_00;
  undefined8 in_stack_fffffffffffff1d8;
  undefined8 in_stack_fffffffffffff1e0;
  undefined8 in_stack_fffffffffffff1e8;
  undefined8 in_stack_fffffffffffff1f0;
  _Manager_type in_stack_fffffffffffff1f8;
  undefined8 in_stack_fffffffffffff200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff208;
  pointer in_stack_fffffffffffff218;
  pointer pRVar2;
  pointer in_stack_fffffffffffff220;
  pointer pRVar3;
  pointer in_stack_fffffffffffff228;
  pointer pRVar4;
  undefined8 in_stack_fffffffffffff230;
  pointer in_stack_fffffffffffff238;
  pointer pRVar5;
  pointer in_stack_fffffffffffff240;
  pointer pRVar6;
  pointer in_stack_fffffffffffff248;
  pointer pRVar7;
  undefined8 in_stack_fffffffffffff250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff268;
  undefined1 in_stack_fffffffffffff278 [16];
  undefined1 in_stack_fffffffffffff288 [56];
  allocator<char> local_d2c;
  allocator<char> local_d2b;
  allocator<char> local_d2a;
  allocator_type local_d29;
  vector<RPCResult,_std::allocator<RPCResult>_> local_d28;
  allocator<char> local_d0a;
  allocator<char> local_d09;
  vector<RPCResult,_std::allocator<RPCResult>_> local_d08;
  allocator<char> local_ceb;
  allocator<char> local_cea;
  allocator<char> local_ce9;
  RPCResults local_ce8;
  allocator_type local_ccf;
  allocator<char> local_cce;
  bool local_ccd;
  allocator<char> local_ccc;
  allocator<char> local_ccb;
  bool local_cca;
  allocator<char> local_cc9;
  vector<RPCArg,_std::allocator<RPCArg>_> local_cc8;
  allocator<char> local_caa;
  allocator<char> local_ca9;
  string local_ca8;
  string local_c88;
  string local_c68;
  string local_c48;
  string local_c28;
  string local_c08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be8;
  char *local_bc8;
  size_type local_bc0;
  char local_bb8 [8];
  undefined8 uStack_bb0;
  string local_ba8 [32];
  string local_b88 [32];
  string local_b68 [32];
  string local_b48 [32];
  RPCResult local_b28;
  string local_aa0 [32];
  string local_a80 [32];
  RPCResult local_a60 [2];
  string local_950 [32];
  string local_930 [32];
  string local_910 [32];
  string local_8f0 [32];
  string local_8d0 [32];
  RPCResult local_8b0;
  string local_828 [32];
  string local_808 [32];
  string local_7e8 [32];
  string local_7c8 [32];
  string local_7a8 [32];
  RPCResult local_788;
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  RPCResult local_6a0 [3];
  RPCArgOptions local_508;
  string local_4c0 [32];
  UniValue local_4a0;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_448;
  string local_3e8 [32];
  RPCArgOptions local_3c8;
  string local_380 [32];
  UniValue local_360;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_308;
  string local_2a8 [32];
  RPCArg local_288 [2];
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"getrawmempool",&local_ca9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "\nReturns all transaction ids in memory pool as a json array of string transaction ids.\n\nHint: use getmempoolentry to fetch a specific transaction from the mempool.\n"
             ,&local_caa);
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"verbose",&local_cc9);
  local_cca = false;
  UniValue::UniValue<bool,_bool,_true>(&local_360,&local_cca);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_308,&local_360);
  std::__cxx11::string::string<std::allocator<char>>
            (local_380,"True for a json object, false for array of transaction ids",&local_ccb);
  local_3c8.oneline_description._M_dataplus._M_p = (pointer)&local_3c8.oneline_description.field_2;
  local_3c8.skip_type_check = false;
  local_3c8.oneline_description._M_string_length = 0;
  local_3c8.oneline_description.field_2._M_local_buf[0] = '\0';
  local_3c8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_3c8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_3c8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_3c8._58_8_ = 0;
  name._M_string_length = in_stack_fffffffffffff1e0;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff1e8;
  name.field_2._8_8_ = in_stack_fffffffffffff1f0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff200;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff1f8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff208;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff218;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff220;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff228;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff230;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff238;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff240;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff248;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff250;
  description_08.field_2 = in_stack_fffffffffffff268;
  description_08._0_16_ = in_stack_fffffffffffff258;
  opts.oneline_description._M_string_length = in_stack_fffffffffffff288._0_8_;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff288._8_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff288._24_24_;
  opts.hidden = (bool)in_stack_fffffffffffff288[0x30];
  opts.also_positional = (bool)in_stack_fffffffffffff288[0x31];
  opts._66_6_ = in_stack_fffffffffffff288._50_6_;
  opts.skip_type_check = (bool)in_stack_fffffffffffff278[0];
  opts._1_7_ = in_stack_fffffffffffff278._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff278._8_8_;
  RPCArg::RPCArg(local_288,name,(Type)local_2a8,fallback,description_08,opts);
  std::__cxx11::string::string<std::allocator<char>>(local_3e8,"mempool_sequence",&local_ccc);
  local_ccd = false;
  UniValue::UniValue<bool,_bool,_true>(&local_4a0,&local_ccd);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_448,&local_4a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4c0,
             "If verbose=false, returns a json object with transaction list and mempool sequence number attached."
             ,&local_cce);
  local_508.oneline_description._M_dataplus._M_p = (pointer)&local_508.oneline_description.field_2;
  local_508.skip_type_check = false;
  local_508.oneline_description._M_string_length = 0;
  local_508.oneline_description.field_2._M_local_buf[0] = '\0';
  local_508.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_508.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_508.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_508.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_508._58_8_ = 0;
  name_00._M_string_length = in_stack_fffffffffffff1e0;
  name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff1e8;
  name_00.field_2._8_8_ = in_stack_fffffffffffff1f0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff200;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff1f8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff208;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff218;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff220;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff228;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff230;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff238;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff240;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff248;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff250;
  description_09.field_2 = in_stack_fffffffffffff268;
  description_09._0_16_ = in_stack_fffffffffffff258;
  opts_00.oneline_description._M_string_length = in_stack_fffffffffffff288._0_8_;
  opts_00.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff288._8_16_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff288._24_24_;
  opts_00.hidden = (bool)in_stack_fffffffffffff288[0x30];
  opts_00.also_positional = (bool)in_stack_fffffffffffff288[0x31];
  opts_00._66_6_ = in_stack_fffffffffffff288._50_6_;
  opts_00.skip_type_check = (bool)in_stack_fffffffffffff278[0];
  opts_00._1_7_ = in_stack_fffffffffffff278._1_7_;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff278._8_8_;
  RPCArg::RPCArg(local_288 + 1,name_00,(Type)local_3e8,fallback_00,description_09,opts_00);
  __l._M_len = 2;
  __l._M_array = local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_cc8,__l,&local_ccf);
  std::__cxx11::string::string<std::allocator<char>>(local_6c0,"for verbose = false",&local_ce9);
  std::__cxx11::string::string<std::allocator<char>>(local_6e0,"",&local_cea);
  std::__cxx11::string::string<std::allocator<char>>(local_700,"",&local_ceb);
  std::__cxx11::string::string<std::allocator<char>>(local_7a8,"",&local_d09);
  std::__cxx11::string::string<std::allocator<char>>(local_7c8,"The transaction id",&local_d0a);
  local_d28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffff1e0;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff1e8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff1f0;
  description._M_string_length = in_stack_fffffffffffff200;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f8;
  description.field_2 = in_stack_fffffffffffff208;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff220;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff218;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff228;
  RPCResult::RPCResult(&local_788,STR_HEX,m_key_name,description,inner,SUB81(local_7a8,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_788;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_d08,__l_00,&local_d29);
  cond._M_string_length = in_stack_fffffffffffff1e0;
  cond._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  cond.field_2._M_allocated_capacity = in_stack_fffffffffffff1e8;
  cond.field_2._8_8_ = in_stack_fffffffffffff1f0;
  m_key_name_04._M_string_length = in_stack_fffffffffffff200;
  m_key_name_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f8;
  m_key_name_04.field_2 = in_stack_fffffffffffff208;
  description_05._M_string_length = (size_type)in_stack_fffffffffffff220;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff218;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff228;
  description_05.field_2._8_8_ = in_stack_fffffffffffff230;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff240;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff238;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff248;
  RPCResult::RPCResult(local_6a0,cond,(Type)local_6c0,m_key_name_04,description_05,inner_04);
  std::__cxx11::string::string<std::allocator<char>>(local_7e8,"for verbose = true",&local_d2a);
  std::__cxx11::string::string<std::allocator<char>>(local_808,"",&local_d2b);
  std::__cxx11::string::string<std::allocator<char>>(local_828,"",&local_d2c);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8d0,"transactionid",(allocator<char> *)&stack0xfffffffffffff2b7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8f0,"",(allocator<char> *)&stack0xfffffffffffff2b6);
  MempoolEntryDescription();
  m_key_name_00._M_string_length = in_stack_fffffffffffff1e0;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff1e8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff1f0;
  description_00._M_string_length = in_stack_fffffffffffff200;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f8;
  description_00.field_2 = in_stack_fffffffffffff208;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff220;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff218;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff228;
  RPCResult::RPCResult(&local_8b0,OBJ,m_key_name_00,description_00,inner_00,SUB81(local_8d0,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_8b0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff2b8,__l_01,
             (allocator_type *)&stack0xfffffffffffff297);
  cond_00._M_string_length = in_stack_fffffffffffff1e0;
  cond_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  cond_00.field_2._M_allocated_capacity = in_stack_fffffffffffff1e8;
  cond_00.field_2._8_8_ = in_stack_fffffffffffff1f0;
  m_key_name_05._M_string_length = in_stack_fffffffffffff200;
  m_key_name_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f8;
  m_key_name_05.field_2 = in_stack_fffffffffffff208;
  description_06._M_string_length = (size_type)in_stack_fffffffffffff220;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff218;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff228;
  description_06.field_2._8_8_ = in_stack_fffffffffffff230;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff240;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff238;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff248;
  RPCResult::RPCResult(local_6a0 + 1,cond_00,(Type)local_7e8,m_key_name_05,description_06,inner_05);
  std::__cxx11::string::string<std::allocator<char>>
            (local_910,"for verbose = false and mempool_sequence = true",
             (allocator<char> *)&stack0xfffffffffffff296);
  std::__cxx11::string::string<std::allocator<char>>
            (local_930,"",(allocator<char> *)&stack0xfffffffffffff295);
  std::__cxx11::string::string<std::allocator<char>>
            (local_950,"",(allocator<char> *)&stack0xfffffffffffff294);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a80,"txids",(allocator<char> *)&stack0xfffffffffffff277);
  std::__cxx11::string::string<std::allocator<char>>
            (local_aa0,"",(allocator<char> *)&stack0xfffffffffffff276);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b48,"",(allocator<char> *)&stack0xfffffffffffff257);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b68,"The transaction id",(allocator<char> *)&stack0xfffffffffffff256);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name_01._M_string_length = in_stack_fffffffffffff1e0;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff1e8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff1f0;
  description_01._M_string_length = in_stack_fffffffffffff200;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f8;
  description_01.field_2 = in_stack_fffffffffffff208;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff220;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff218;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff228;
  RPCResult::RPCResult(&local_b28,STR_HEX,m_key_name_01,description_01,inner_01,SUB81(local_b48,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_b28;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff258,__l_02,
             (allocator_type *)&stack0xfffffffffffff237);
  m_key_name_02._M_string_length = in_stack_fffffffffffff1e0;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff1e8;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff1f0;
  description_02._M_string_length = in_stack_fffffffffffff200;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f8;
  description_02.field_2 = in_stack_fffffffffffff208;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff220;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff218;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff228;
  RPCResult::RPCResult(local_a60,ARR,m_key_name_02,description_02,inner_02,SUB81(local_a80,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_b88,"mempool_sequence",(allocator<char> *)&stack0xfffffffffffff236);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ba8,"The mempool sequence value.",(allocator<char> *)&stack0xfffffffffffff235);
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  m_key_name_03._M_string_length = in_stack_fffffffffffff1e0;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff1e8;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff1f0;
  description_03._M_string_length = in_stack_fffffffffffff200;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f8;
  description_03.field_2 = in_stack_fffffffffffff208;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(local_a60 + 1,NUM,m_key_name_03,description_03,inner_03,SUB81(local_b88,0));
  __l_03._M_len = 2;
  __l_03._M_array = local_a60;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff278,__l_03,
             (allocator_type *)&stack0xfffffffffffff217);
  cond_01._M_string_length = in_stack_fffffffffffff1e0;
  cond_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  cond_01.field_2._M_allocated_capacity = in_stack_fffffffffffff1e8;
  cond_01.field_2._8_8_ = in_stack_fffffffffffff1f0;
  m_key_name_06._M_string_length = in_stack_fffffffffffff200;
  m_key_name_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f8;
  m_key_name_06.field_2 = in_stack_fffffffffffff208;
  description_07._M_string_length = (size_type)pRVar3;
  description_07._M_dataplus._M_p = (pointer)pRVar2;
  description_07.field_2._M_allocated_capacity = (size_type)pRVar4;
  description_07.field_2._8_8_ = in_stack_fffffffffffff230;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar6;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar5;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar7;
  RPCResult::RPCResult(local_6a0 + 2,cond_01,(Type)local_910,m_key_name_06,description_07,inner_06);
  results_00._M_len = 3;
  results_00._M_array = local_6a0;
  RPCResults::RPCResults(&local_ce8,results_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c28,"getrawmempool",(allocator<char> *)&stack0xfffffffffffff216);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c48,"true",(allocator<char> *)&stack0xfffffffffffff215);
  HelpExampleCli(&local_c08,&local_c28,&local_c48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c88,"getrawmempool",(allocator<char> *)&stack0xfffffffffffff214);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ca8,"true",(allocator<char> *)&stack0xfffffffffffff213);
  HelpExampleRpc(&local_c68,&local_c88,&local_ca8);
  std::operator+(&local_be8,&local_c08,&local_c68);
  local_bc8 = local_bb8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_be8._M_dataplus._M_p == &local_be8.field_2) {
    uStack_bb0 = local_be8.field_2._8_8_;
  }
  else {
    local_bc8 = local_be8._M_dataplus._M_p;
  }
  local_bc0 = local_be8._M_string_length;
  local_be8._M_string_length = 0;
  local_be8.field_2._M_local_buf[0] = '\0';
  description_04._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:411:9)>
       ::_M_invoke;
  description_04._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:411:9)>
                ::_M_manager;
  description_04.field_2 = in_stack_fffffffffffff208;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar3;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar4;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar5;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff230;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar6;
  examples.m_examples._M_string_length = in_stack_fffffffffffff250;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar7;
  examples.m_examples.field_2 = in_stack_fffffffffffff258;
  fun.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffff278._0_8_;
  fun._M_invoker = (_Invoker_type)in_stack_fffffffffffff278._8_8_;
  fun.super__Function_base._M_functor._M_pod_data = in_stack_fffffffffffff268._M_local_buf;
  local_be8._M_dataplus._M_p = (pointer)&local_be8.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff1e0,&stack0xfffffffffffff1e8)),
             description_04,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff1e8);
  std::__cxx11::string::~string((string *)&local_bc8);
  std::__cxx11::string::~string((string *)&local_be8);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::~string((string *)&local_ca8);
  std::__cxx11::string::~string((string *)&local_c88);
  std::__cxx11::string::~string((string *)&local_c08);
  std::__cxx11::string::~string((string *)&local_c48);
  std::__cxx11::string::~string((string *)&local_c28);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ce8.m_results);
  lVar1 = 0x110;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_6a0[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff278);
  lVar1 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_a60[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff218);
  std::__cxx11::string::~string(local_ba8);
  std::__cxx11::string::~string(local_b88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff258);
  RPCResult::~RPCResult(&local_b28);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff238);
  std::__cxx11::string::~string(local_b68);
  std::__cxx11::string::~string(local_b48);
  std::__cxx11::string::~string(local_aa0);
  std::__cxx11::string::~string(local_a80);
  std::__cxx11::string::~string(local_950);
  std::__cxx11::string::~string(local_930);
  std::__cxx11::string::~string(local_910);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff2b8);
  RPCResult::~RPCResult(&local_8b0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff298);
  std::__cxx11::string::~string(local_8f0);
  std::__cxx11::string::~string(local_8d0);
  std::__cxx11::string::~string(local_828);
  std::__cxx11::string::~string(local_808);
  std::__cxx11::string::~string(local_7e8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_d08);
  RPCResult::~RPCResult(&local_788);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_d28);
  std::__cxx11::string::~string(local_7c8);
  std::__cxx11::string::~string(local_7a8);
  std::__cxx11::string::~string(local_700);
  std::__cxx11::string::~string(local_6e0);
  std::__cxx11::string::~string(local_6c0);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_cc8);
  lVar1 = 0x108;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_288[0].m_names._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x108;
  } while (lVar1 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_508);
  std::__cxx11::string::~string(local_4c0);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_448);
  UniValue::~UniValue(&local_4a0);
  std::__cxx11::string::~string(local_3e8);
  RPCArgOptions::~RPCArgOptions(&local_3c8);
  std::__cxx11::string::~string(local_380);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_308);
  UniValue::~UniValue(&local_360);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getrawmempool()
{
    return RPCHelpMan{"getrawmempool",
        "\nReturns all transaction ids in memory pool as a json array of string transaction ids.\n"
        "\nHint: use getmempoolentry to fetch a specific transaction from the mempool.\n",
        {
            {"verbose", RPCArg::Type::BOOL, RPCArg::Default{false}, "True for a json object, false for array of transaction ids"},
            {"mempool_sequence", RPCArg::Type::BOOL, RPCArg::Default{false}, "If verbose=false, returns a json object with transaction list and mempool sequence number attached."},
        },
        {
            RPCResult{"for verbose = false",
                RPCResult::Type::ARR, "", "",
                {
                    {RPCResult::Type::STR_HEX, "", "The transaction id"},
                }},
            RPCResult{"for verbose = true",
                RPCResult::Type::OBJ_DYN, "", "",
                {
                    {RPCResult::Type::OBJ, "transactionid", "", MempoolEntryDescription()},
                }},
            RPCResult{"for verbose = false and mempool_sequence = true",
                RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::ARR, "txids", "",
                    {
                        {RPCResult::Type::STR_HEX, "", "The transaction id"},
                    }},
                    {RPCResult::Type::NUM, "mempool_sequence", "The mempool sequence value."},
                }},
        },
        RPCExamples{
            HelpExampleCli("getrawmempool", "true")
            + HelpExampleRpc("getrawmempool", "true")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    bool fVerbose = false;
    if (!request.params[0].isNull())
        fVerbose = request.params[0].get_bool();

    bool include_mempool_sequence = false;
    if (!request.params[1].isNull()) {
        include_mempool_sequence = request.params[1].get_bool();
    }

    return MempoolToJSON(EnsureAnyMemPool(request.context), fVerbose, include_mempool_sequence);
},
    };
}